

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O1

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenEnum
          (KotlinKMPGenerator *this,EnumDef *enum_def,CodeWriter *writer)

{
  long *plVar1;
  long *plVar2;
  _Manager_type *pp_Var3;
  size_type *psVar4;
  string field_type;
  string enum_type;
  _Any_data local_158;
  _Manager_type local_148;
  code *pcStack_140;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((enum_def->super_Definition).generated == false) {
    GenerateComment(this,&(enum_def->super_Definition).doc_comment,writer,
                    (CommentConfig *)(anonymous_namespace)::comment_config);
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_50,&this->namer_,enum_def);
    GenTypeBasic_abi_cxx11_(&local_90,this,&(enum_def->underlying_type).base_type);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"@Suppress(\"unused\")","");
    CodeWriter::operator+=(writer,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"@JvmInline","");
    CodeWriter::operator+=(writer,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_70,"value class ",&local_50);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_130 = &local_120;
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_120 = *plVar2;
      lStack_118 = plVar1[3];
    }
    else {
      local_120 = *plVar2;
      local_130 = (long *)*plVar1;
    }
    local_128 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_130,(ulong)local_90._M_dataplus._M_p);
    pp_Var3 = (_Manager_type *)(plVar1 + 2);
    if ((_Manager_type *)*plVar1 == pp_Var3) {
      local_148 = *pp_Var3;
      pcStack_140 = (code *)plVar1[3];
      local_158._M_unused._M_object = &local_148;
    }
    else {
      local_148 = *pp_Var3;
      local_158._M_unused._M_object = (_Manager_type *)*plVar1;
    }
    local_158._8_8_ = plVar1[1];
    *plVar1 = (long)pp_Var3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append(local_158._M_pod_data);
    psVar4 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_110.field_2._M_allocated_capacity = *psVar4;
      local_110.field_2._8_8_ = plVar1[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar4;
      local_110._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_110._M_string_length = plVar1[1];
    *plVar1 = (long)psVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    CodeWriter::operator+=(writer,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((_Manager_type *)local_158._M_unused._0_8_ != &local_148) {
      operator_delete(local_158._M_unused._M_object,(ulong)(local_148 + 1));
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + 1;
    local_148 = (_Manager_type)0x0;
    pcStack_140 = (code *)0x0;
    local_158._M_unused._M_object = (void *)0x0;
    local_158._8_8_ = 0;
    local_158._M_unused._M_object = operator_new(0x20);
    *(EnumDef **)local_158._M_unused._0_8_ = enum_def;
    *(CodeWriter **)((long)local_158._M_unused._0_8_ + 8) = writer;
    *(KotlinKMPGenerator **)((long)local_158._M_unused._0_8_ + 0x10) = this;
    *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
     ((long)local_158._M_unused._0_8_ + 0x18) = &local_50;
    pcStack_140 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:391:37)>
                  ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:391:37)>
                ::_M_manager;
    GenerateCompanionObject(this,writer,(function<void_()> *)&local_158);
    if (local_148 != (_Manager_type)0x0) {
      (*local_148)(&local_158,&local_158,__destroy_functor);
    }
    if (writer->cur_ident_lvl_ != 0) {
      writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + -1;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"}","");
    CodeWriter::operator+=(writer,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenEnum(EnumDef &enum_def, CodeWriter &writer) const {
    if (enum_def.generated) return;

    GenerateComment(enum_def.doc_comment, writer, &comment_config);
    auto enum_type = namer_.Type(enum_def);
    auto field_type = GenTypeBasic(enum_def.underlying_type.base_type);
    writer += "@Suppress(\"unused\")";
    writer += "@JvmInline";
    writer += "value class " + enum_type + " (val value: " + field_type + ") {";
    writer.IncrementIdentLevel();

    GenerateCompanionObject(writer, [&]() {
      // Write all properties
      auto vals = enum_def.Vals();

      for (auto it = vals.begin(); it != vals.end(); ++it) {
        auto &ev = **it;
        auto val = enum_def.ToString(ev);
        auto suffix = LiteralSuffix(enum_def.underlying_type);
        writer.SetValue("name", namer_.Variant(ev));
        writer.SetValue("type", enum_type);
        writer.SetValue("val", val + suffix);
        GenerateComment(ev.doc_comment, writer, &comment_config);
        writer += "val {{name}} = {{type}}({{val}})";
      }

      // Generate a generate string table for enum values.
      // Problem is, if values are very sparse that could generate really
      // big tables. Ideally in that case we generate a map lookup
      // instead, but for the moment we simply don't output a table at all.
      auto range = enum_def.Distance();
      // Average distance between values above which we consider a table
      // "too sparse". Change at will.
      static const uint64_t kMaxSparseness = 5;
      if (range / static_cast<uint64_t>(enum_def.size()) < kMaxSparseness) {
        GeneratePropertyOneLine(writer, "names", "Array<String>", [&]() {
          writer += "arrayOf(\\";
          auto val = enum_def.Vals().front();
          for (auto it = vals.begin(); it != vals.end(); ++it) {
            auto ev = *it;
            for (auto k = enum_def.Distance(val, ev); k > 1; --k)
              writer += "\"\", \\";
            val = ev;
            writer += "\"" + (*it)->name + "\"\\";
            if (it + 1 != vals.end()) { writer += ", \\"; }
          }
          writer += ")";
        });
        std::string e_param = "e: " + enum_type;
        GenerateFunOneLine(
            writer, "name", e_param, "String",
            [&]() {
              writer += "names[e.value.toInt()\\";
              if (enum_def.MinValue()->IsNonZero())
                writer += " - " + namer_.Variant(*enum_def.MinValue()) +
                          ".value.toInt()\\";
              writer += "]";
            },
            parser_.opts.gen_jvmstatic);
      }
    });
    writer.DecrementIdentLevel();
    writer += "}";
  }